

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutputWithSpecials_Test::
~TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutputWithSpecials_Test
          (TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutputWithSpecials_Test *this)

{
  TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutputWithSpecials_Test *this_local;
  
  ~TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutputWithSpecials_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, UTPRINTOutputInJUnitOutputWithSpecials)
{
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname").thatPrints("The <rain> in \"Spain\"\nGoes \\mainly\\ down the Dr&in\n")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<system-out>The &lt;rain&gt; in &quot;Spain&quot;{newline}Goes \\mainly\\ down the Dr&amp;in{newline}</system-out>\n", outputFile->lineFromTheBack(3));
}